

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O3

int XUtf8UcsWidth(XUtf8FontStruct *font_set,uint ucs)

{
  uint uVar1;
  XFontStruct **ppXVar2;
  unsigned_short uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char glyph [2];
  XChar2b buf [8];
  undefined2 local_5a;
  int *local_58;
  int *local_50;
  undefined2 local_48 [12];
  
  uVar1 = font_set->nb_font;
  if (0 < (int)uVar1) {
    local_58 = font_set->ranges;
    local_50 = font_set->encodings;
    ppXVar2 = font_set->fonts;
    uVar6 = 0;
    do {
      if (ppXVar2[uVar6] != (XFontStruct *)0x0) {
        uVar3 = XUtf8IsNonSpacing(ucs);
        uVar7 = (uint)uVar3;
        if (uVar3 == 0) {
          uVar7 = ucs;
        }
        uVar8 = uVar6;
        if ((int)(uint)uVar6 < (int)uVar1) goto LAB_001fd365;
        uVar8 = uVar6 & 0xffffffff;
        goto LAB_001fd3af;
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return 0;
LAB_001fd3af:
  uVar7 = (uint)uVar8;
  if (uVar7 != uVar1) goto LAB_001fd3cf;
  goto LAB_001fd3b4;
LAB_001fd365:
  do {
    if (ppXVar2[uVar8] != (XFontStruct *)0x0) {
      iVar5 = local_50[uVar8];
      iVar4 = ucs2fontmap((char *)&local_5a,uVar7,iVar5);
      if ((-1 < iVar4) &&
         ((iVar5 != 0 ||
          ((local_58[uVar8 * 2] <= (int)uVar7 && ((int)uVar7 <= local_58[uVar8 * 2 + 1]))))))
      goto LAB_001fd3af;
    }
    uVar8 = uVar8 + 1;
  } while (uVar1 != uVar8);
LAB_001fd3b4:
  ucs2fontmap((char *)&local_5a,0x3f,local_50[uVar6]);
  uVar7 = (uint)uVar6;
LAB_001fd3cf:
  local_48[0] = local_5a;
  iVar5 = XTextWidth16(ppXVar2[(int)uVar7],local_48,1);
  return iVar5;
}

Assistant:

int
XUtf8UcsWidth(XUtf8FontStruct  *font_set,
	      unsigned int     ucs) {

  int		x;
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[8];     /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		first;      /* first valid font index */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */
  unsigned int  no_spc;

  nb_font = font_set->nb_font;
  x = 0;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return x;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return x;
  }

  first = fnum;

  no_spc = XUtf8IsNonSpacing(ucs);
  if (no_spc) ucs = no_spc;

  /*
   * find the first encoding which can be used to
   * draw the glyph
   */
  fnum = first;
  while (fnum < nb_font) {
    if (fonts[fnum] &&
	ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
      if (encodings[fnum] != 0 || ((int)ucs >= ranges[fnum * 2] &&
	  (int)ucs <= ranges[fnum * 2 + 1])) {
	break;
      }
    }
    fnum++;
  }
  if (fnum == nb_font) {
    /* the char is not valid in all encodings ->
     * draw it using the first font :-(
     */
    fnum = first;
    ucs2fontmap(glyph, '?', encodings[fnum]);
  }

  (*buf).byte1 = glyph[0];
  (*buf).byte2 = glyph[1];

  x += XTextWidth16(fonts[fnum], buf, 1);

  return x;
}